

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitRefNull(FunctionValidator *this,RefNull *curr)

{
  bool bVar1;
  Function *pFVar2;
  Module *pMVar3;
  bool local_19;
  RefNull *curr_local;
  FunctionValidator *this_local;
  
  pFVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
           getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
  local_19 = true;
  if (pFVar2 != (Function *)0x0) {
    pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    local_19 = FeatureSet::hasReferenceTypes(&pMVar3->features);
  }
  shouldBeTrue<wasm::RefNull*>
            (this,local_19,curr,"ref.null requires reference-types [--enable-reference-types]");
  bVar1 = wasm::Type::isNullable
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.
                      type);
  bVar1 = shouldBeTrue<wasm::RefNull*>(this,bVar1,curr,"ref.null types must be nullable");
  if (bVar1) {
    bVar1 = wasm::Type::isNull(&(curr->super_SpecificExpression<(wasm::Expression::Id)41>).
                                super_Expression.type);
    shouldBeTrue<wasm::RefNull*>(this,bVar1,curr,"ref.null must have a bottom heap type");
  }
  return;
}

Assistant:

void FunctionValidator::visitRefNull(RefNull* curr) {
  // If we are not in a function, this is a global location like a table. We
  // allow RefNull there as we represent tables that way regardless of what
  // features are enabled.
  shouldBeTrue(!getFunction() || getModule()->features.hasReferenceTypes(),
               curr,
               "ref.null requires reference-types [--enable-reference-types]");
  if (!shouldBeTrue(
        curr->type.isNullable(), curr, "ref.null types must be nullable")) {
    return;
  }
  shouldBeTrue(
    curr->type.isNull(), curr, "ref.null must have a bottom heap type");
}